

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

StatementSyntax * __thiscall
slang::parsing::Parser::parseDisableStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  DisableForkStatementSyntax *pDVar2;
  NameSyntax *name;
  __extent_storage<18446744073709551615UL> _Var3;
  Token disable;
  Token TVar4;
  Token semi;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  _Var3 = attributes._M_extent._M_extent_value;
  disable = ParserBase::consume(&this->super_ParserBase);
  bVar1 = ParserBase::peek(&this->super_ParserBase,ForkKeyword);
  local_68.super_SyntaxListBase.childCount = _Var3._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = _Var3._M_extent_value;
  if (bVar1) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005dac60;
    semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar2 = slang::syntax::SyntaxFactory::disableForkStatement
                       (&this->factory,label,&local_68,disable,TVar4,semi);
  }
  else {
    name = parseName(this);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005dac60;
    TVar4 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar2 = (DisableForkStatementSyntax *)
             slang::syntax::SyntaxFactory::disableStatement
                       (&this->factory,label,&local_68,disable,name,TVar4);
  }
  return &pDVar2->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseDisableStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto disable = consume();
    if (peek(TokenKind::ForkKeyword)) {
        auto fork = consume();
        return factory.disableForkStatement(label, attributes, disable, fork,
                                            expect(TokenKind::Semicolon));
    }

    auto& name = parseName();
    return factory.disableStatement(label, attributes, disable, name, expect(TokenKind::Semicolon));
}